

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDualRail(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint local_70;
  int fVerbose;
  int fCheckOne;
  int fCheckZero;
  int fComplPo;
  int fMiterFfs;
  int fDualDcFfs;
  int fDualFfs;
  int nDualPis;
  int c;
  Vec_Int_t *vDcFlops;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAig = (Aig_Man_t *)0x0;
  _nDualPis = (Vec_Int_t *)0x0;
  fDualDcFfs = 0;
  fMiterFfs = 0;
  bVar1 = false;
  fCheckZero = 0;
  fCheckOne = 0;
  fVerbose = 0;
  local_70 = 0;
  bVar2 = false;
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  do {
    iVar3 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"Itxfczovh");
    if (iVar3 == -1) {
      pNtkNew = Abc_FrameReadNtk(pAStack_18);
      if (pNtkNew == (Abc_Ntk_t *)0x0) {
        Abc_Print(1,"Main AIG: There is no current network.\n");
        return 0;
      }
      iVar3 = Abc_NtkIsStrash(pNtkNew);
      if (iVar3 == 0) {
        Abc_Print(1,"Main AIG: The current network is not an AIG.\n");
        return 0;
      }
      if (bVar1) {
        _nDualPis = Abc_NtkFindDcLatches(pNtkNew);
      }
      pAigNew = Abc_NtkToDar(pNtkNew,0,1);
      vDcFlops = (Vec_Int_t *)
                 Saig_ManDupDual(pAigNew,_nDualPis,fDualDcFfs,fMiterFfs,fCheckZero,fCheckOne,
                                 fVerbose,local_70);
      Aig_ManStop(pAigNew);
      pAig = (Aig_Man_t *)Abc_NtkFromAigPhase((Aig_Man_t *)vDcFlops);
      pcVar4 = Extra_UtilStrsav(pNtkNew->pName);
      pAig->pSpec = pcVar4;
      Aig_ManStop((Aig_Man_t *)vDcFlops);
      Vec_IntFreeP((Vec_Int_t **)&nDualPis);
      Abc_FrameReplaceCurrentNetwork(pAStack_18,(Abc_Ntk_t *)pAig);
      return 0;
    }
    switch(iVar3) {
    case 0x49:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_0029c91c;
      }
      fDualDcFfs = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      globalUtilOptind = globalUtilOptind + 1;
      if (fDualDcFfs < 0) {
LAB_0029c91c:
        Abc_Print(-2,"usage: dualrail [-I num] [-txfczovh]\n");
        Abc_Print(-2,"\t         transforms the current AIG into a dual-rail miter\n");
        Abc_Print(-2,"\t         expressing the property \"at least one PO has ternary value\"\n");
        Abc_Print(-2,"\t         (to compute an initialization sequence, use switches \"-tfc\")\n");
        Abc_Print(-2,"\t-I num : the number of first PIs interpreted as ternary [default = %d]\n",
                  (ulong)(uint)fDualDcFfs);
        pcVar4 = "const0 init values";
        if (fMiterFfs != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-t     : toggle ternary flop init values for all flops [default = %s]\n",
                  pcVar4);
        pcVar4 = "const0 init values";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,
                  "\t-x     : toggle ternary flop init values for DC-valued flops [default = %s]\n",
                  pcVar4);
        pcVar4 = "POs";
        if (fCheckZero != 0) {
          pcVar4 = "flops";
        }
        Abc_Print(-2,"\t-f     : toggle mitering flops instead of POs [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fCheckOne != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-c     : toggle complementing the miter output [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fVerbose != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-z     : toggle checking PO==0 instead of PO==X [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (local_70 != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-o     : toggle checking PO==1 instead of PO==X [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar2) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      Abc_Print(-2,"Unknown switch.\n");
      goto LAB_0029c91c;
    case 99:
      fCheckOne = fCheckOne ^ 1;
      break;
    case 0x66:
      fCheckZero = fCheckZero ^ 1;
      break;
    case 0x68:
      goto LAB_0029c91c;
    case 0x6f:
      local_70 = local_70 ^ 1;
      break;
    case 0x74:
      fMiterFfs = fMiterFfs ^ 1;
      break;
    case 0x76:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x78:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x7a:
      fVerbose = fVerbose ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDualRail( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Abc_NtkFindDcLatches( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk, * pNtkNew = NULL;
    Aig_Man_t * pAig, * pAigNew;
    Vec_Int_t * vDcFlops = NULL;
    int c;
    int nDualPis   = 0;
    int fDualFfs   = 0;
    int fDualDcFfs = 0;
    int fMiterFfs  = 0;
    int fComplPo   = 0;
    int fCheckZero = 0;
    int fCheckOne  = 0;
    int fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Itxfczovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nDualPis = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDualPis < 0 )
                goto usage;
            break;
        case 't':
            fDualFfs ^= 1;
            break;
        case 'x':
            fDualDcFfs ^= 1;
            break;
        case 'f':
            fMiterFfs ^= 1;
            break;
        case 'c':
            fComplPo ^= 1;
            break;
        case 'z':
            fCheckZero ^= 1;
            break;
        case 'o':
            fCheckOne ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Main AIG: There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        return 0;
    }

    if ( fDualDcFfs )
        vDcFlops = Abc_NtkFindDcLatches( pNtk );

    // transform
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    pAigNew = Saig_ManDupDual( pAig, vDcFlops, nDualPis, fDualFfs, fMiterFfs, fComplPo, fCheckZero, fCheckOne );
    Aig_ManStop( pAig );
    pNtkNew = Abc_NtkFromAigPhase( pAigNew );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    Aig_ManStop( pAigNew );
    Vec_IntFreeP( &vDcFlops );

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: dualrail [-I num] [-txfczovh]\n" );
    Abc_Print( -2, "\t         transforms the current AIG into a dual-rail miter\n" );
    Abc_Print( -2, "\t         expressing the property \"at least one PO has ternary value\"\n" );
    Abc_Print( -2, "\t         (to compute an initialization sequence, use switches \"-tfc\")\n" );
    Abc_Print( -2, "\t-I num : the number of first PIs interpreted as ternary [default = %d]\n", nDualPis );
    Abc_Print( -2, "\t-t     : toggle ternary flop init values for all flops [default = %s]\n", fDualFfs? "yes": "const0 init values" );
    Abc_Print( -2, "\t-x     : toggle ternary flop init values for DC-valued flops [default = %s]\n", fDualDcFfs? "yes": "const0 init values" );
    Abc_Print( -2, "\t-f     : toggle mitering flops instead of POs [default = %s]\n", fMiterFfs? "flops": "POs" );
    Abc_Print( -2, "\t-c     : toggle complementing the miter output [default = %s]\n", fComplPo? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle checking PO==0 instead of PO==X [default = %s]\n", fCheckZero? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle checking PO==1 instead of PO==X [default = %s]\n", fCheckOne? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}